

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host.cpp
# Opt level: O0

int __thiscall chatter::Host::shutdown(Host *this,int __fd,int __how)

{
  bool bVar1;
  int extraout_EAX;
  reference peer_00;
  Peer *peer;
  iterator __end1;
  iterator __begin1;
  vector<chatter::Peer,_std::allocator<chatter::Peer>_> *__range1;
  Host *this_local;
  
  __end1 = std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::begin(&this->m_peers);
  peer = (Peer *)std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::end(&this->m_peers);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<chatter::Peer_*,_std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>_>
                                *)&peer);
    if (!bVar1) break;
    peer_00 = __gnu_cxx::
              __normal_iterator<chatter::Peer_*,_std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>_>
              ::operator*(&__end1);
    if (peer_00->m_state == CONNECTED) {
      Protocol::disconnect(&this->m_protocol,peer_00);
    }
    Peer::reset(peer_00);
    __gnu_cxx::
    __normal_iterator<chatter::Peer_*,_std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>_>
    ::operator++(&__end1);
  }
  this->m_run_threads = false;
  std::vector<chatter::Peer,_std::allocator<chatter::Peer>_>::clear(&this->m_peers);
  destroy_socket(this);
  return extraout_EAX;
}

Assistant:

void Host::shutdown()
{
    for (auto &peer : m_peers) {
        if (peer.m_state == PeerState::CONNECTED) {
            m_protocol.disconnect(&peer);
        }
        peer.reset();
    }

    m_run_threads = false;
    m_peers.clear();

    /* TODO(ben): Wait for network thread to stop? */
    destroy_socket();
}